

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O1

bool __thiscall
GdlRenderer::CheckTablesAndPasses(GdlRenderer *this,GrcManager *pcman,int *pcpassValid)

{
  bool bVar1;
  uint __val;
  uint uVar2;
  GdlRuleTable *pGVar3;
  uint uVar4;
  int *in_RCX;
  uint __len;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int nPassNum;
  string __str;
  uint local_154;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_154 = 0;
  this->m_ipassBidi = -1;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"linebreak","");
  pGVar3 = FindRuleTable(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (pGVar3 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses(pGVar3,pcman,(int *)&local_154,in_RCX);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"substitution","");
  pGVar3 = FindRuleTable(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (pGVar3 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses(pGVar3,pcman,(int *)&local_154,in_RCX);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"justification","");
  pGVar3 = FindRuleTable(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (pGVar3 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses(pGVar3,pcman,(int *)&local_154,in_RCX);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"positioning","");
  pGVar3 = FindRuleTable(this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (pGVar3 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses(pGVar3,pcman,(int *)&local_154,in_RCX);
  }
  __val = local_154;
  *pcpassValid = local_154;
  if ((0 < this->m_nBidi) && (this->m_ipassBidi == -1)) {
    this->m_ipassBidi = local_154;
  }
  if ((int)local_154 < 0x80) {
    if (local_154 != 0) {
      return true;
    }
    paVar6 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"No valid passes","");
    GrcErrorList::AddWarning(&g_errorList,0xdae,(GdlObject *)0x0,&local_50);
    _Var5._M_p = local_50._M_dataplus._M_p;
  }
  else {
    paVar6 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Number of passes (","");
    uVar2 = 4;
    uVar4 = __val;
    do {
      __len = uVar2;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_001368f3;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_001368f3;
      }
      if (uVar4 < 10000) goto LAB_001368f3;
      bVar1 = 99999 < uVar4;
      uVar2 = __len + 4;
      uVar4 = uVar4 / 10000;
    } while (bVar1);
    __len = __len + 1;
LAB_001368f3:
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_150,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_150._M_dataplus._M_p,__len,__val);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,") exceeds maximum of ","")
    ;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_130,'\x03');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_130._M_dataplus._M_p,3,0x7f);
    GrcErrorList::AddItem
              (&g_errorList,true,0xc1d,(GdlObject *)0x0,(GrpLineAndFile *)0x0,&local_f0,&local_150,
               &local_110,&local_130,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    _Var5._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      _Var5._M_p = local_f0._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar6) {
    operator_delete(_Var5._M_p,paVar6->_M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool GdlRenderer::CheckTablesAndPasses(GrcManager * pcman, int * pcpassValid)
{
	int nPassNum = 0;

	GdlRuleTable * prultbl;

	m_ipassBidi = -1;

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	//if (Bidi())
	//	m_ipassBidi = nPassNum;
	//else
	//	m_ipassBidi = -1;

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	//	At this point nPassNum = the number of valid passes.
	*pcpassValid = nPassNum;

	if (this->Bidi() && m_ipassBidi == -1)
		m_ipassBidi = nPassNum;

	if (nPassNum >= kMaxPasses)
	{
		g_errorList.AddError(3101, NULL,
			"Number of passes (",
			std::to_string(nPassNum),
			") exceeds maximum of ",
			std::to_string(kMaxPasses - 1));
	}
	else if (nPassNum == 0)
	{
		g_errorList.AddWarning(3502, NULL,
			"No valid passes");
	}

	return true;
}